

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QMdi::Rearranger_*>::move(QList<QMdi::Rearranger_*> *this,qsizetype from,qsizetype to)

{
  long lVar1;
  long lVar2;
  Rearranger **ppRVar3;
  Rearranger **ppRVar4;
  
  if (from == to) {
    return;
  }
  detach(this);
  ppRVar3 = (this->d).ptr;
  if (from < to) {
    lVar1 = from * 8;
    ppRVar4 = ppRVar3 + from + 1;
    lVar2 = to * 8;
  }
  else {
    lVar1 = to * 8;
    ppRVar4 = ppRVar3 + from;
    lVar2 = from * 8;
  }
  std::_V2::__rotate<QMdi::Rearranger**>((long)ppRVar3 + lVar1,ppRVar4,(long)ppRVar3 + lVar2 + 8);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }